

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::Detail::registerListenerImpl(unique_ptr<Catch::EventListenerFactory> *listenerFactory)

{
  IMutableRegistryHub *pIVar1;
  unique_ptr<Catch::EventListenerFactory> local_18;
  unique_ptr<Catch::EventListenerFactory> *local_10;
  unique_ptr<Catch::EventListenerFactory> *listenerFactory_local;
  
  local_10 = listenerFactory;
  pIVar1 = getMutableRegistryHub();
  unique_ptr<Catch::EventListenerFactory>::unique_ptr(&local_18,listenerFactory);
  (*pIVar1->_vptr_IMutableRegistryHub[3])(pIVar1,&local_18);
  unique_ptr<Catch::EventListenerFactory>::~unique_ptr(&local_18);
  return;
}

Assistant:

void registerListenerImpl( Detail::unique_ptr<EventListenerFactory> listenerFactory ) {
            getMutableRegistryHub().registerListener( CATCH_MOVE(listenerFactory) );
        }